

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qprocess_unix.cpp
# Opt level: O3

void __thiscall anon_unknown.dwarf_14cf1db::QChildProcess::startProcess(QChildProcess *this)

{
  _Head_base<0UL,_char_**,_false> __argv;
  _Head_base<0UL,_char_**,_false> __envp;
  char cVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  __pid_t _Var5;
  __gid_t __gid;
  __uid_t __uid;
  int iVar6;
  int *piVar7;
  QProcessPrivate *d;
  int sig;
  char *pcVar8;
  byte bVar9;
  _Head_base<0UL,_QProcessPrivate::UnixExtras_*,_false> _Var10;
  undefined4 uVar11;
  sigset_t set;
  _union_1457 local_158;
  undefined1 *apuStack_150 [19];
  sigset_t local_b8;
  
  QProcessPrivate::commitChannels(this->d);
  iVar3 = this->d->childStartedPipe[0];
  do {
    iVar2 = close(iVar3);
    if (iVar2 != -1) break;
    piVar7 = __errno_location();
  } while (*piVar7 == 4);
  if ((-1 < this->workingDirectory) && (iVar3 = fchdir(this->workingDirectory), iVar3 == -1)) {
    d = this->d;
    piVar7 = __errno_location();
    iVar3 = *piVar7;
    pcVar8 = "fchdir";
    goto LAB_00425ed7;
  }
  _Var10._M_head_impl =
       (this->d->unixExtras)._M_t.
       super___uniq_ptr_impl<QProcessPrivate::UnixExtras,_std::default_delete<QProcessPrivate::UnixExtras>_>
       ._M_t.
       super__Tuple_impl<0UL,_QProcessPrivate::UnixExtras_*,_std::default_delete<QProcessPrivate::UnixExtras>_>
       .super__Head_base<0UL,_QProcessPrivate::UnixExtras_*,_false>._M_head_impl;
  if ((_Any_data *)_Var10._M_head_impl == (_Any_data *)0x0) {
    memset(&local_158,0,0x98);
    sigaction(0xd,(sigaction *)&local_158,(sigaction *)0x0);
LAB_00425c2f:
    if (this->isUsingVfork == true) {
      pthread_sigmask(2,(__sigset_t *)&this->oldsigset,(__sigset_t *)0x0);
    }
  }
  else {
    if (*(long *)((long)&(_Var10._M_head_impl)->childProcessModifier + 0x10) != 0) {
      (**(_Invoker_type *)((long)&(_Var10._M_head_impl)->childProcessModifier + 0x18))
                ((_Any_data *)_Var10._M_head_impl);
      _Var10._M_head_impl =
           (this->d->unixExtras)._M_t.
           super___uniq_ptr_impl<QProcessPrivate::UnixExtras,_std::default_delete<QProcessPrivate::UnixExtras>_>
           ._M_t.
           super__Tuple_impl<0UL,_QProcessPrivate::UnixExtras_*,_std::default_delete<QProcessPrivate::UnixExtras>_>
           .super__Head_base<0UL,_QProcessPrivate::UnixExtras_*,_false>._M_head_impl;
    }
    uVar4 = *(uint *)((long)_Var10._M_head_impl + 0x20);
    bVar9 = (byte)uVar4;
    if ((uVar4 & 2) != 0) {
      memset(apuStack_150,0,0x90);
      local_158 = (_union_1457)0x1;
      sigaction(0xd,(sigaction *)&local_158,(sigaction *)0x0);
      uVar4 = *(uint *)((long)_Var10._M_head_impl + 0x20);
    }
    if ((uVar4 & 1) != 0) {
      memset(&local_158,0,0x98);
      iVar3 = 1;
      do {
        if ((bVar9 >> 1 & iVar3 == 0xd) == 0) {
          sigaction(iVar3,(sigaction *)&local_158,(sigaction *)0x0);
        }
        iVar3 = iVar3 + 1;
      } while (iVar3 != 0x41);
      local_b8.__val[0xe] = (ulong)&DAT_aaaaaaaaaaaaaaaa;
      local_b8.__val[0xf] = (ulong)&DAT_aaaaaaaaaaaaaaaa;
      local_b8.__val[0xc] = (ulong)&DAT_aaaaaaaaaaaaaaaa;
      local_b8.__val[0xd] = (ulong)&DAT_aaaaaaaaaaaaaaaa;
      local_b8.__val[10] = (ulong)&DAT_aaaaaaaaaaaaaaaa;
      local_b8.__val[0xb] = (ulong)&DAT_aaaaaaaaaaaaaaaa;
      local_b8.__val[8] = (ulong)&DAT_aaaaaaaaaaaaaaaa;
      local_b8.__val[9] = (ulong)&DAT_aaaaaaaaaaaaaaaa;
      local_b8.__val[6] = (ulong)&DAT_aaaaaaaaaaaaaaaa;
      local_b8.__val[7] = (ulong)&DAT_aaaaaaaaaaaaaaaa;
      local_b8.__val[4] = (ulong)&DAT_aaaaaaaaaaaaaaaa;
      local_b8.__val[5] = (ulong)&DAT_aaaaaaaaaaaaaaaa;
      local_b8.__val[2] = (ulong)&DAT_aaaaaaaaaaaaaaaa;
      local_b8.__val[3] = (ulong)&DAT_aaaaaaaaaaaaaaaa;
      local_b8.__val[0] = (ulong)&DAT_aaaaaaaaaaaaaaaa;
      local_b8.__val[1] = (ulong)&DAT_aaaaaaaaaaaaaaaa;
      sigemptyset(&local_b8);
      sigprocmask(2,&local_b8,(sigset_t *)0x0);
      uVar4 = *(uint *)((long)_Var10._M_head_impl + 0x20);
    }
    if ((uVar4 & 0x10) != 0) {
      iVar3 = 3;
      if (3 < *(int *)((long)_Var10._M_head_impl + 0x24)) {
        iVar3 = *(int *)((long)_Var10._M_head_impl + 0x24);
      }
      iVar2 = close_range(iVar3,0x7fffffff,4);
      if (iVar2 == -1) {
        local_158.sa_handler = (__sighandler_t)&DAT_aaaaaaaaaaaaaaaa;
        apuStack_150[0] = &DAT_aaaaaaaaaaaaaaaa;
        iVar2 = getrlimit(RLIMIT_NOFILE,(rlimit *)&local_158);
        uVar11 = 0x7fffffff;
        if (iVar2 == 0) {
          uVar11 = local_158._0_4_;
        }
        if (iVar3 < (int)uVar11) {
          do {
            fcntl(iVar3,2,1);
            iVar3 = iVar3 + 1;
          } while (uVar11 != iVar3);
        }
      }
    }
    cVar1 = (char)*(uint *)((long)_Var10._M_head_impl + 0x20);
    if ((*(uint *)((long)_Var10._M_head_impl + 0x20) & 0x40) != 0) {
      _Var5 = setsid();
      if (_Var5 < 0) {
        pcVar8 = "setsid";
        piVar7 = __errno_location();
        goto LAB_00425dc3;
      }
      cVar1 = (char)*(undefined4 *)((long)_Var10._M_head_impl + 0x20);
    }
    if ((cVar1 < '\0') && (iVar3 = ::open("/dev/tty",0x100), -1 < iVar3)) {
      iVar6 = ioctl(iVar3,0x5422);
      piVar7 = __errno_location();
      iVar2 = *piVar7;
      close(iVar3);
      if (iVar6 != 0) {
        *piVar7 = iVar2;
        pcVar8 = "ioctl";
LAB_00425dc3:
        failChildProcess(this->d,pcVar8,*piVar7);
      }
    }
    uVar4 = *(uint *)((long)_Var10._M_head_impl + 0x20);
    if ((uVar4 >> 9 & 1) != 0) {
      local_158.sa_handler = (__sighandler_t)&DAT_aaaaaaaaaaaaaaaa;
      apuStack_150[0] = &DAT_aaaaaaaaaaaaaaaa;
      iVar3 = getrlimit(RLIMIT_CORE,(rlimit *)&local_158);
      if ((iVar3 == 0) && (local_158.sa_handler != (__sighandler_t)0x0)) {
        local_158.sa_handler = (__sighandler_t)0x0;
        setrlimit(RLIMIT_CORE,(rlimit *)&local_158);
      }
      uVar4 = *(uint *)((long)_Var10._M_head_impl + 0x20);
    }
    if ((uVar4 >> 8 & 1) != 0) {
      __gid = getgid();
      setgid(__gid);
      __uid = getuid();
      setuid(__uid);
    }
    uVar4 = *(uint *)&(((this->d->unixExtras)._M_t.
                        super___uniq_ptr_impl<QProcessPrivate::UnixExtras,_std::default_delete<QProcessPrivate::UnixExtras>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_QProcessPrivate::UnixExtras_*,_std::default_delete<QProcessPrivate::UnixExtras>_>
                        .super__Head_base<0UL,_QProcessPrivate::UnixExtras_*,_false>._M_head_impl)->
                      processParameters).flags;
    if ((uVar4 & 3) == 0) {
      memset(&local_158,0,0x98);
      sigaction(0xd,(sigaction *)&local_158,(sigaction *)0x0);
    }
    if ((uVar4 & 1) == 0) goto LAB_00425c2f;
  }
  __argv._M_head_impl =
       (this->argv).pointers._M_t.super___uniq_ptr_impl<char_*,_std::default_delete<char_*[]>_>._M_t
       .super__Tuple_impl<0UL,_char_**,_std::default_delete<char_*[]>_>.
       super__Head_base<0UL,_char_**,_false>._M_head_impl;
  __envp._M_head_impl =
       (this->envp).pointers._M_t.super___uniq_ptr_impl<char_*,_std::default_delete<char_*[]>_>._M_t
       .super__Tuple_impl<0UL,_char_**,_std::default_delete<char_*[]>_>.
       super__Head_base<0UL,_char_**,_false>._M_head_impl;
  pcVar8 = *__argv._M_head_impl;
  if (__envp._M_head_impl == (char **)0x0) {
    do {
      iVar3 = execv(pcVar8,__argv._M_head_impl);
      if (iVar3 != -1) break;
      piVar7 = __errno_location();
    } while (*piVar7 == 4);
  }
  else {
    do {
      iVar3 = execve(pcVar8,__argv._M_head_impl,__envp._M_head_impl);
      if (iVar3 != -1) break;
      piVar7 = __errno_location();
    } while (*piVar7 == 4);
  }
  d = this->d;
  piVar7 = __errno_location();
  iVar3 = *piVar7;
  pcVar8 = "execve";
LAB_00425ed7:
  failChildProcess(d,pcVar8,iVar3);
}

Assistant:

void QChildProcess::startProcess() const noexcept
{
    // Render channels configuration.
    d->commitChannels();

    // make sure this fd is closed if execv() succeeds
    qt_safe_close(d->childStartedPipe[0]);

    // enter the working directory
    if (workingDirectory >= 0 && fchdir(workingDirectory) == -1)
        failChildProcess(d, "fchdir", errno);

    bool sigpipeHandled = false;
    bool sigmaskHandled = false;
    if (d->unixExtras) {
        // FIRST we call the user modifier function, before we dropping
        // privileges or closing non-standard file descriptors
        callChildProcessModifier(d);

        // then we apply our other user-provided parameters
        if (const char *what = applyProcessParameters(d->unixExtras->processParameters))
            failChildProcess(d, what, errno);

        auto flags = d->unixExtras->processParameters.flags;
        using P = QProcess::UnixProcessFlag;
        sigpipeHandled = flags.testAnyFlags(P::ResetSignalHandlers | P::IgnoreSigPipe);
        sigmaskHandled = flags.testFlag(P::ResetSignalHandlers);
    }
    if (!sigpipeHandled) {
        // reset the signal that we ignored
        QtVforkSafe::change_sigpipe(SIG_DFL);       // reset the signal that we ignored
    }
    if (!sigmaskHandled) {
        // restore the signal mask from the parent, if applyProcessParameters()
        // hasn't completely reset it
        restoreSignalMask();
    }

    // execute the process
    if (!envp.pointers)
        qt_safe_execv(argv[0], argv);
    else
        qt_safe_execve(argv[0], argv, envp);
    failChildProcess(d, "execve", errno);
}